

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfile.h
# Opt level: O0

void __thiscall CVmFile::write_str_byte_prefix(CVmFile *this,char *str,size_t len)

{
  char *in_RDX;
  CVmFile *in_RSI;
  CVmFile *in_RDI;
  char in_stack_ffffffffffffffdf;
  
  if ((char *)0xff < in_RDX) {
    err_throw(0);
  }
  write_byte(in_RDI,in_stack_ffffffffffffffdf);
  write_bytes(in_RSI,in_RDX,(size_t)in_RDI);
  return;
}

Assistant:

void write_str_byte_prefix(const char *str, size_t len)
    {
        /* make sure it fits */
        if (len > 255)
            err_throw(VMERR_WRITE_FILE);

        /* write the prefix and the string */
        write_byte((char)len);
        write_bytes(str, len);
    }